

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

gzFile gz_open(void *path,int fd,char *mode)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  gz_state *state;
  size_t sVar5;
  char *__s;
  __off64_t _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (path == (void *)0x0) {
    return (gzFile)0x0;
  }
  state = (gz_state *)aligned_alloc(0x40,0x100);
  iVar8 = 0;
  if (state == (gz_state *)0x0) {
    return (gzFile)0x0;
  }
  state->size = 0;
  state->want = 0x20000;
  state->msg = (char *)0x0;
  uVar10 = 0xffffffff;
  iVar7 = 0;
  iVar9 = 0;
  bVar2 = 0;
  bVar4 = 0;
  for (; cVar1 = *mode, cVar1 != '\0'; mode = mode + 1) {
    bVar3 = bVar4;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar10 = (uint)(byte)(cVar1 - 0x30U);
    }
    else {
      switch(cVar1) {
      case 'a':
        iVar8 = 1;
        break;
      case 'b':
      case 'c':
      case 'd':
      case 'g':
        break;
      case 'e':
        bVar2 = 1;
        break;
      case 'f':
        iVar9 = 1;
        break;
      case 'h':
        iVar9 = 2;
        break;
      default:
        if (cVar1 == 'F') {
          iVar9 = 4;
        }
        else if (cVar1 == 'R') {
          iVar9 = 3;
        }
        else if (cVar1 == 'T') {
          iVar7 = 1;
        }
        else if (cVar1 == 'r') {
          iVar8 = 0x1c4f;
        }
        else if (cVar1 == 'w') {
          iVar8 = 0x79b1;
        }
        else {
          bVar3 = 1;
          if ((cVar1 != 'x') && (bVar3 = bVar4, cVar1 == '+')) goto LAB_0013cceb;
        }
      }
    }
    bVar4 = bVar3;
  }
  state->strategy = iVar9;
  state->direct = iVar7;
  state->mode = iVar8;
  state->level = uVar10;
  if (iVar8 == 0x1c4f) {
    if (iVar7 != 0) goto LAB_0013cceb;
    state->direct = 1;
  }
  else if (iVar8 == 0) goto LAB_0013cceb;
  sVar5 = strlen((char *)path);
  __s = (char *)malloc(sVar5 + 1);
  state->path = __s;
  if (__s == (char *)0x0) {
LAB_0013cceb:
    free(state);
    return (gzFile)0x0;
  }
  uVar10 = 0;
  snprintf(__s,sVar5 + 1,"%s",path);
  if (iVar8 != 0x1c4f) {
    uVar10 = (uint)bVar4 * 0x80 + (uint)(iVar8 != 0x79b1) * 0x200 + 0x241;
  }
  if (fd < 0) {
    fd = open((char *)path,uVar10 | (uint)bVar2 << 0x13,0x1b6);
    state->fd = fd;
    if (fd == -1) {
      free(__s);
      goto LAB_0013cceb;
    }
  }
  else {
    state->fd = fd;
  }
  if (iVar8 == 1) {
    lseek64(fd,0,2);
    state->mode = 0x79b1;
  }
  else if (iVar8 == 0x1c4f) {
    _Var6 = lseek64(fd,0,1);
    if (_Var6 == -1) {
      _Var6 = 0;
    }
    state->start = _Var6;
  }
  gz_reset(state);
  return &state->x;
}

Assistant:

static gzFile gz_open(const void *path, int fd, const char *mode) {
    gz_state *state;
    size_t len;
    int oflag;
#ifdef O_CLOEXEC
    int cloexec = 0;
#endif
#ifdef O_EXCL
    int exclusive = 0;
#endif

    /* check input */
    if (path == NULL)
        return NULL;

    /* allocate gzFile structure to return */
    state = (gz_state *)zng_alloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    state->direct = 0;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9') {
            state->level = *mode - '0';
        } else {
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                zng_free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
#ifdef O_CLOEXEC
            case 'e':
                cloexec = 1;
                break;
#endif
#ifdef O_EXCL
            case 'x':
                exclusive = 1;
                break;
#endif
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
                break;
            case 'T':
                state->direct = 1;
                break;
            default:        /* could consider as an error, but just ignore */
                {}
            }
        }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        zng_free(state);
        return NULL;
    }

    /* can't force transparent read */
    if (state->mode == GZ_READ) {
        if (state->direct) {
            zng_free(state);
            return NULL;
        }
        state->direct = 1;      /* for empty file */
    }

    /* save the path name for error messages */
#ifdef WIDECHAR
    if (fd == -2) {
        len = wcstombs(NULL, (const wchar_t *)path, 0);
        if (len == (size_t)-1)
            len = 0;
    } else
#endif
        len = strlen((const char *)path);
    state->path = (char *)malloc(len + 1);
    if (state->path == NULL) {
        zng_free(state);
        return NULL;
    }
#ifdef WIDECHAR
    if (fd == -2)
        if (len) {
            wcstombs(state->path, (const wchar_t *)path, len + 1);
        } else {
            *(state->path) = 0;
        }
    else
#endif
        (void)snprintf(state->path, len + 1, "%s", (const char *)path);

    /* compute the flags for open() */
    oflag =
#ifdef O_LARGEFILE
        O_LARGEFILE |
#endif
#ifdef O_BINARY
        O_BINARY |
#endif
#ifdef O_CLOEXEC
        (cloexec ? O_CLOEXEC : 0) |
#endif
        (state->mode == GZ_READ ?
         O_RDONLY :
         (O_WRONLY | O_CREAT |
#ifdef O_EXCL
          (exclusive ? O_EXCL : 0) |
#endif
          (state->mode == GZ_WRITE ?
           O_TRUNC :
           O_APPEND)));

    /* open the file with the appropriate flags (or just use fd) */
    state->fd = fd > -1 ? fd : (
#if defined(_WIN32)
        fd == -2 ? _wopen((const wchar_t *)path, oflag, 0666) :
#elif __CYGWIN__
        fd == -2 ? open(state->path, oflag, 0666) :
#endif
        open((const char *)path, oflag, 0666));
    if (state->fd == -1) {
        free(state->path);
        zng_free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND) {
        LSEEK(state->fd, 0, SEEK_END);  /* so gzoffset() is correct */
        state->mode = GZ_WRITE;         /* simplify later checks */
    }

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}